

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::runCommand
          (InterCallTestCase *this,WriteDataInterleaved *cmd,int stepNdx,int *programFriendlyName)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  reference ppSVar6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  int local_1dc;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  long local_30;
  Functions *gl;
  int *programFriendlyName_local;
  WriteDataInterleaved *pWStack_18;
  int stepNdx_local;
  WriteDataInterleaved *cmd_local;
  InterCallTestCase *this_local;
  
  gl = (Functions *)programFriendlyName;
  programFriendlyName_local._4_4_ = stepNdx;
  pWStack_18 = cmd;
  cmd_local = (WriteDataInterleaved *)this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_30 = CONCAT44(extraout_var,iVar2);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [18])"Running program #");
  *(int *)&gl->activeShaderProgram = *(int *)&gl->activeShaderProgram + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)gl);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2c14d21);
  local_1c8[0] = "image";
  if (this->m_storage == STORAGE_BUFFER) {
    local_1c8[0] = "buffer";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c03fa3);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pWStack_18->targetHandle);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c7b265);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])"\tWriting to every ");
  local_1d0 = "odd";
  if ((pWStack_18->evenOdd & 1U) != 0) {
    local_1d0 = "even";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1d0);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c6cdd6);
  local_1d8 = "column";
  if (this->m_storage == STORAGE_BUFFER) {
    local_1d8 = "element";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1d8);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c7b265);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"\tDispatch size: ");
  local_1dc = this->m_invocationGridSize / 2;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1dc);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a8224a);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_invocationGridSize);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b5e49a);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  pcVar1 = *(code **)(local_30 + 0x1680);
  ppSVar6 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::operator[]
                      (&this->m_operationPrograms,(long)programFriendlyName_local._4_4_);
  dVar3 = glu::ShaderProgram::getProgram(*ppSVar6);
  (*pcVar1)(dVar3);
  if (this->m_storage == STORAGE_BUFFER) {
    pcVar1 = *(code **)(local_30 + 0x48);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&pWStack_18->targetHandle);
    (*pcVar1)(0x90d2,0,*pmVar7);
    dVar3 = (**(code **)(local_30 + 0x800))();
    glu::checkError(dVar3,"bind destination buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x625);
  }
  else if (this->m_storage == STORAGE_IMAGE) {
    pcVar1 = *(code **)(local_30 + 0x80);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&pWStack_18->targetHandle);
    uVar8 = 0x88b9;
    if ((this->m_useAtomic & 1U) != 0) {
      uVar8 = 0x88ba;
    }
    uVar9 = 0x822e;
    if ((this->m_formatInteger & 1U) != 0) {
      uVar9 = 0x8235;
    }
    (*pcVar1)(0,*pmVar7,0,0,0,uVar8,uVar9);
    dVar3 = (**(code **)(local_30 + 0x800))();
    glu::checkError(dVar3,"bind destination image",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x62c);
  }
  (**(code **)(local_30 + 0x528))
            ((long)this->m_invocationGridSize / 2 & 0xffffffff,this->m_invocationGridSize,1);
  dVar3 = (**(code **)(local_30 + 0x800))();
  glu::checkError(dVar3,"dispatch write",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x633);
  return;
}

Assistant:

void InterCallTestCase::runCommand (const op::WriteDataInterleaved& cmd, int stepNdx, int& programFriendlyName)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Running program #" << ++programFriendlyName << " to write " << ((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) << " #" << cmd.targetHandle << ".\n"
		<< "	Writing to every " << ((cmd.evenOdd) ? ("even") : ("odd")) << " " << ((m_storage == STORAGE_BUFFER) ? ("element") : ("column")) << ".\n"
		<< "	Dispatch size: " << m_invocationGridSize / 2 << "x" << m_invocationGridSize << "."
		<< tcu::TestLog::EndMessage;

	gl.useProgram(m_operationPrograms[stepNdx]->getProgram());

	// set destination
	if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(m_storageIDs[cmd.targetHandle]);

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storageIDs[cmd.targetHandle]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind destination buffer");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(m_storageIDs[cmd.targetHandle]);

		gl.bindImageTexture(0, m_storageIDs[cmd.targetHandle], 0, GL_FALSE, 0, (m_useAtomic) ? (GL_READ_WRITE) : (GL_WRITE_ONLY), (m_formatInteger) ? (GL_R32I) : (GL_R32F));
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind destination image");
	}
	else
		DE_ASSERT(DE_FALSE);

	// calc
	gl.dispatchCompute(m_invocationGridSize / 2, m_invocationGridSize, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch write");
}